

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

string * __thiscall
lest::to_string<void(S::*)()>(string *__return_storage_ptr__,lest *this,offset_in_S_to_subr *value)

{
  offset_in_S_to_subr *value_local;
  
  string_maker<void(S::*)()>::to_string_abi_cxx11_
            (__return_storage_ptr__,*(void **)this,*(offset_in_S_to_subr *)(this + 8));
  return __return_storage_ptr__;
}

Assistant:

inline std::string to_string( T const & value )
{
    return string_maker<T>::to_string( value );
}